

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryTargetCount(Display *dpy,int target_type,int *value)

{
  int iVar1;
  undefined1 *puVar2;
  undefined4 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  xnvCtrlQueryTargetCountReq *req;
  xnvCtrlQueryTargetCountReply rep;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffa8;
  undefined1 local_48 [8];
  undefined4 local_40;
  XExtDisplayInfo *local_28;
  undefined4 *local_20;
  undefined4 local_14;
  long local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_28 = find_display(in_stack_ffffffffffffffa8);
  if ((local_28 == (XExtDisplayInfo *)0x0) || (local_28->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((local_28 == (XExtDisplayInfo *)0x0) || (local_28->codes == (XExtCodes *)0x0)) {
    XMissingExtension(local_10,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    if (*(long *)(local_10 + 0x968) != 0) {
      (*(code *)**(undefined8 **)(local_10 + 0x968))(local_10);
    }
    puVar2 = (undefined1 *)_XGetRequest(local_10,0x18,8);
    *puVar2 = (char)local_28->codes->major_opcode;
    puVar2[1] = 0x18;
    *(undefined4 *)(puVar2 + 4) = local_14;
    iVar1 = _XReply(local_10,local_48,0,1);
    if (iVar1 == 0) {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = 0;
    }
    else {
      if (local_20 != (undefined4 *)0x0) {
        *local_20 = local_40;
      }
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLQueryTargetCount (
    Display *dpy,
    int target_type,
    int *value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryTargetCountReply  rep;
    xnvCtrlQueryTargetCountReq   *req;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryTargetCount, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryTargetCount;
    req->target_type = target_type;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    if (value) *value = rep.count;
    UnlockDisplay (dpy);
    SyncHandle ();
    return True;
}